

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O0

void __thiscall
QPDFArgParser::addHelpTopic(QPDFArgParser *this,string *topic,string *short_text,string *long_text)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  logic_error *plVar4;
  element_type *peVar5;
  size_type sVar6;
  mapped_type *this_00;
  mapped_type *pmVar7;
  allocator<char> local_131;
  key_type local_130;
  HelpTopic local_110;
  undefined1 local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_55;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *local_28;
  string *long_text_local;
  string *short_text_local;
  string *topic_local;
  QPDFArgParser *this_local;
  
  local_28 = long_text;
  long_text_local = short_text;
  short_text_local = topic;
  topic_local = (string *)this;
  bVar1 = std::operator==(topic,"all");
  if (bVar1) {
    QTC::TC("libtests","QPDFArgParser add reserved help topic",0);
    local_55 = 1;
    plVar4 = (logic_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_48,"QPDFArgParser: can\'t register reserved help topic ",short_text_local)
    ;
    std::logic_error::logic_error(plVar4,(string *)&local_48);
    local_55 = 0;
    __cxa_throw(plVar4,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  lVar2 = std::__cxx11::string::length();
  if (lVar2 != 0) {
    pcVar3 = (char *)std::__cxx11::string::at((ulong)short_text_local);
    if (*pcVar3 != '-') {
      peVar5 = std::
               __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      sVar6 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic>_>_>
              ::count(&peVar5->help_topics,short_text_local);
      if (sVar6 != 0) {
        QTC::TC("libtests","QPDFArgParser add existing topic",0);
        local_99 = 1;
        plVar4 = (logic_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_98,"QPDFArgParser: topic ",short_text_local);
        std::operator+(&local_78,&local_98," has already been added");
        std::logic_error::logic_error(plVar4,(string *)&local_78);
        local_99 = 0;
        __cxa_throw(plVar4,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      HelpTopic::HelpTopic(&local_110,long_text_local,local_28);
      peVar5 = std::
               __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      this_00 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic>_>_>
                ::operator[](&peVar5->help_topics,short_text_local);
      HelpTopic::operator=(this_00,&local_110);
      HelpTopic::~HelpTopic(&local_110);
      peVar5 = std::
               __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"help",&local_131);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>_>
               ::operator[](&peVar5->help_option_table,&local_130);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert(&pmVar7->choices,short_text_local);
      std::__cxx11::string::~string((string *)&local_130);
      std::allocator<char>::~allocator(&local_131);
      return;
    }
  }
  QTC::TC("libtests","QPDFArgParser bad topic for help",0);
  plVar4 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(plVar4,"QPDFArgParser: help topics must not start with -");
  __cxa_throw(plVar4,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void
QPDFArgParser::addHelpTopic(
    std::string const& topic, std::string const& short_text, std::string const& long_text)
{
    if (topic == "all") {
        QTC::TC("libtests", "QPDFArgParser add reserved help topic");
        throw std::logic_error("QPDFArgParser: can't register reserved help topic " + topic);
    }
    if (!((topic.length() > 0) && (topic.at(0) != '-'))) {
        QTC::TC("libtests", "QPDFArgParser bad topic for help");
        throw std::logic_error("QPDFArgParser: help topics must not start with -");
    }
    if (m->help_topics.count(topic)) {
        QTC::TC("libtests", "QPDFArgParser add existing topic");
        throw std::logic_error("QPDFArgParser: topic " + topic + " has already been added");
    }

    m->help_topics[topic] = HelpTopic(short_text, long_text);
    m->help_option_table["help"].choices.insert(topic);
}